

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::LocalsWalker::LocalsWalker(LocalsWalker *this,DiagStackFrame *_frame,DWORD _frameWalkerFlags)

{
  byte bVar1;
  Type TVar2;
  DiagStackFrame *pDVar3;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  DWORD DVar8;
  int iVar9;
  RegSlot RVar10;
  ScopeType SVar11;
  undefined4 extraout_var;
  FunctionBody *this_00;
  ArenaAllocator *alloc;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar12;
  FrameDisplay *this_01;
  ScopeObjectChain *pSVar13;
  VariableWalkerBase *pVVar14;
  undefined4 extraout_var_02;
  DebuggerScope *pDVar15;
  void *pvVar16;
  undefined4 *puVar17;
  undefined *puVar18;
  undefined4 extraout_var_03;
  void *scope;
  DiagScopeVariablesWalker *this_02;
  undefined **ppuVar19;
  RecyclableObjectWalker *this_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  byte bVar20;
  uint i;
  uint index;
  uint uVar21;
  undefined **local_70;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  (this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
       (_func_int **)&PTR_Get_014f7ad0;
  this->pFrame = _frame;
  this->pVarWalkers =
       (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  this->totalLocalsCount = 0;
  this->frameWalkerFlags = _frameWalkerFlags;
  this->hasUserNotDefinedArguments = false;
  iVar7 = (*_frame->_vptr_DiagStackFrame[2])(_frame);
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar7));
  if (this_00 == (FunctionBody *)0x0) {
    return;
  }
  if ((((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->field_0xa8
      & 4) != 0) {
    return;
  }
  iVar7 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
  alloc = (ArenaAllocator *)CONCAT44(extraout_var_00,iVar7);
  uVar21 = 0;
  pLVar12 = (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
  (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  alloc = alloc;
  (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f9d90;
  pLVar12->length = 0;
  pLVar12->increment = 4;
  this->pVarWalkers = pLVar12;
  iVar7 = (*this->pFrame->_vptr_DiagStackFrame[0xf])();
  this_01 = (FrameDisplay *)CONCAT44(extraout_var_01,iVar7);
  if (this_01 != (FrameDisplay *)0x0) {
    uVar21 = (uint)this_01->length;
  }
  pSVar13 = FunctionBody::GetScopeObjectChain(this_00);
  if (pSVar13 != (ScopeObjectChain *)0x0) {
    pLVar12 = this->pVarWalkers;
    pVVar14 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x38,alloc,0x366bee);
    DVar8 = this->frameWalkerFlags;
    pVVar14->pFrame = this->pFrame;
    pVVar14->instance = (Var)0x0;
    pVVar14->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    pVVar14->groupType = UIGroupType_InnerScope;
    pVVar14->allowLexicalThis = false;
    pVVar14->allowSuperReference = false;
    (pVVar14->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)&PTR_Get_014f79f0;
    pVVar14[1].super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase = (_func_int **)0x0
    ;
    *(undefined4 *)&pVVar14[1].pFrame = 0;
    *(undefined1 *)((long)&pVVar14[1].pFrame + 4) = 0;
    *(byte *)((long)&pVVar14[1].pFrame + 5) = (byte)DVar8 >> 1 & 1;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar12,0);
    iVar7 = (pLVar12->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar14;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
  }
  if (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 0x10) == 0) {
    bVar20 = 0;
  }
  else {
    bVar20 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 ^ 1;
  }
  bVar5 = (byte)this->frameWalkerFlags;
  if (((~bVar20 | bVar5 >> 4) & 1) == 0) {
    pLVar12 = this->pVarWalkers;
    pVVar14 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
    pDVar3 = this->pFrame;
    iVar7 = (*pDVar3->_vptr_DiagStackFrame[0x11])(pDVar3);
    pVVar14->pFrame = pDVar3;
    pVVar14->instance = (Var)CONCAT44(extraout_var_02,iVar7);
    pVVar14->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    *(undefined8 *)((long)&pVVar14->pMembersList + 6) = 0;
    (pVVar14->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)&PTR_Get_014f87b0;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar12,0);
    iVar7 = (pLVar12->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar14;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
  }
  pDVar15 = GetScopeWhenHaltAtFormals(this->pFrame);
  DVar8 = GetCurrentFramesLocalsType(this->pFrame);
  if (((pDVar15 == (DebuggerScope *)0x0) ||
      (iVar7 = (pDVar15->range).end, iVar9 = GetAdjustedByteCodeOffset(this->pFrame), iVar7 <= iVar9
      )) || (index = 0, (this_00->field_0x17b & 4) != 0)) {
    if ((DVar8 & 4) == 0) {
      if ((DVar8 & 2) != 0) {
        if (uVar21 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x458,"(scopeCount > 0)","scopeCount > 0");
          if (!bVar6) goto LAB_008bff75;
          *puVar17 = 0;
        }
        pVVar14 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
        pDVar3 = this->pFrame;
        pvVar16 = FrameDisplay::GetItem(this_01,0);
        bVar1 = (byte)this->frameWalkerFlags;
        pVVar14->pFrame = pDVar3;
        pVVar14->instance = pvVar16;
        pVVar14->pMembersList =
             (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0;
        pVVar14->groupType = UIGroupType_None;
        pVVar14->allowLexicalThis = (bool)(bVar1 >> 2 & 1);
        pVVar14->allowSuperReference = (bool)(bVar1 >> 3 & 1);
        puVar18 = &SlotArrayVariablesWalker::vtable;
        goto LAB_008bfa0e;
      }
      if (((uVar21 == 0) || (RVar10 = FunctionBody::GetFrameDisplayRegister(this_00), RVar10 == 0))
         || ((this_00->field_0x17b & 4) == 0)) {
        pVVar14 = (VariableWalkerBase *)0x0;
        index = 0;
      }
      else {
        pVVar14 = (VariableWalkerBase *)0x0;
        pvVar16 = FrameDisplay::GetItem(this_01,0);
        iVar7 = (*this->pFrame->_vptr_DiagStackFrame[10])();
        index = 1;
        if (pvVar16 != *(void **)(*(long *)(CONCAT44(extraout_var_06,iVar7) + 8) + 0x438)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar17 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x45e,
                                      "((Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull())"
                                      ,
                                      "(Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull()"
                                     );
          if (!bVar6) goto LAB_008bff75;
          *puVar17 = 0;
          pVVar14 = (VariableWalkerBase *)0x0;
        }
      }
    }
    else {
      if (uVar21 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x452,"(scopeCount > 0)","scopeCount > 0");
        if (!bVar6) goto LAB_008bff75;
        *puVar17 = 0;
      }
      pVVar14 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
      pDVar3 = this->pFrame;
      pvVar16 = FrameDisplay::GetItem(this_01,0);
      bVar1 = (byte)this->frameWalkerFlags;
      pVVar14->pFrame = pDVar3;
      pVVar14->instance = pvVar16;
      pVVar14->pMembersList =
           (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
      pVVar14->groupType = UIGroupType_None;
      pVVar14->allowLexicalThis = (bool)(bVar1 >> 2 & 1);
      pVVar14->allowSuperReference = (bool)(bVar1 >> 3 & 1);
      puVar18 = &ObjectVariablesWalker::vtable;
LAB_008bfa0e:
      (pVVar14->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
           (_func_int **)(puVar18 + 0x10);
      index = 1;
    }
    if (pVVar14 != (VariableWalkerBase *)0x0) {
      pLVar12 = this->pVarWalkers;
      JsUtil::
      List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(pLVar12,0);
      iVar7 = (pLVar12->
              super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
              .count;
      (pLVar12->
      super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer
      [iVar7] = pVVar14;
      (pLVar12->
      super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).count =
           iVar7 + 1;
    }
  }
  if ((pDVar15 != (DebuggerScope *)0x0) && ((this_00->field_0x17b & 4) == 0)) {
    pvVar16 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,PropertyIdOnRegSlotsContainer);
    if (pvVar16 != (void *)0x0) {
      pvVar16 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,PropertyIdOnRegSlotsContainer);
      DVar8 = DVar8 | *(int *)((long)pvVar16 + 0xc) != -1;
    }
    if (uVar21 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x470,"(scopeCount > 0)","scopeCount > 0");
      if (!bVar6) {
LAB_008bff75:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar17 = 0;
    }
    TVar2 = pDVar15->scopeType;
    pLVar12 = this->pVarWalkers;
    pVVar14 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
    pDVar3 = this->pFrame;
    pvVar16 = FrameDisplay::GetItem(this_01,index);
    bVar1 = (byte)this->frameWalkerFlags;
    pVVar14->pFrame = pDVar3;
    pVVar14->instance = pvVar16;
    pVVar14->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    pVVar14->groupType = UIGroupType_Param;
    pVVar14->allowLexicalThis = (bool)(bVar1 >> 2 & 1);
    pVVar14->allowSuperReference = (bool)(bVar1 >> 3 & 1);
    if (TVar2 == DiagParamScopeInObject) {
      puVar18 = &ObjectVariablesWalker::vtable;
    }
    else {
      puVar18 = &SlotArrayVariablesWalker::vtable;
    }
    (pVVar14->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)(puVar18 + 0x10);
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar12,0);
    iVar7 = (pLVar12->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar14;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
    index = index + 1;
  }
  if ((DVar8 & 1) != 0) {
    pLVar12 = this->pVarWalkers;
    pVVar14 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
    DVar8 = this->frameWalkerFlags;
    pVVar14->pFrame = this->pFrame;
    pVVar14->instance = (Var)0x0;
    pVVar14->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    *(undefined8 *)((long)&pVVar14->pMembersList + 5) = 0;
    pVVar14->allowSuperReference = (bool)((byte)DVar8 >> 3 & 1);
    (pVVar14->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)&PTR_Get_014f86c0;
    pVVar14[1].super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase = (_func_int **)0x0
    ;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar12,0);
    iVar7 = (pLVar12->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar14;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
  }
  iVar7 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  if (index < uVar21) {
    pvVar16 = *(void **)(*(long *)(CONCAT44(extraout_var_03,iVar7) + 8) + 0x438);
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_70 = &PTR_Get_014f8760;
    do {
      scope = FrameDisplay::GetItem(this_01,index);
      if ((scope != (void *)0x0) && (scope != pvVar16)) {
        SVar11 = FrameDisplay::GetScopeType(scope);
        if (SVar11 == ScopeType_WithScope) {
          if ((this->frameWalkerFlags & 2) == 0) goto LAB_008bfe48;
          this_03 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x366bee);
          iVar7 = (*this->pFrame->_vptr_DiagStackFrame[10])();
          RecyclableObjectWalker::RecyclableObjectWalker
                    (this_03,(ScriptContext *)CONCAT44(extraout_var_04,iVar7),scope);
          pLVar12 = this->pVarWalkers;
          this_02 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x366bee);
          DiagScopeVariablesWalker::DiagScopeVariablesWalker
                    (this_02,this->pFrame,scope,(IDiagObjectModelWalkerBase *)this_03);
        }
        else {
          if (SVar11 == ScopeType_SlotArray) {
            pLVar12 = this->pVarWalkers;
            this_02 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
            bVar1 = (byte)this->frameWalkerFlags;
            (this_02->super_VariableWalkerBase).pFrame = this->pFrame;
            (this_02->super_VariableWalkerBase).instance = scope;
            (this_02->super_VariableWalkerBase).pMembersList =
                 (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0;
            (this_02->super_VariableWalkerBase).groupType = UIGroupType_Scope;
            (this_02->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
            (this_02->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
            ppuVar19 = &PTR_Get_014f8710;
          }
          else {
            if (SVar11 != ScopeType_ActivationObject) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar17 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0x499,"(false)","false");
              if (bVar6) {
                *puVar17 = 0;
                goto LAB_008bfe48;
              }
              goto LAB_008bff75;
            }
            pLVar12 = this->pVarWalkers;
            this_02 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
            bVar1 = (byte)this->frameWalkerFlags;
            (this_02->super_VariableWalkerBase).pFrame = this->pFrame;
            (this_02->super_VariableWalkerBase).instance = scope;
            (this_02->super_VariableWalkerBase).pMembersList =
                 (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0;
            (this_02->super_VariableWalkerBase).groupType = UIGroupType_Scope;
            (this_02->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
            (this_02->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
            ppuVar19 = local_70;
          }
          (this_02->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
          _vptr_IDiagObjectModelWalkerBase = (_func_int **)ppuVar19;
        }
        JsUtil::
        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pLVar12,0);
        iVar7 = (pLVar12->
                super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (pLVar12->
        super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
        buffer[iVar7] = &this_02->super_VariableWalkerBase;
        (pLVar12->
        super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).count
             = iVar7 + 1;
      }
LAB_008bfe48:
      index = index + 1;
    } while (uVar21 != index);
  }
  if (((bVar20 | bVar5 >> 4) & 1) == 0) {
    pLVar12 = this->pVarWalkers;
    pVVar14 = (VariableWalkerBase *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
    pDVar3 = this->pFrame;
    iVar7 = (*pDVar3->_vptr_DiagStackFrame[0x11])(pDVar3);
    pVVar14->pFrame = pDVar3;
    pVVar14->instance = (Var)CONCAT44(extraout_var_05,iVar7);
    pVVar14->pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    pVVar14->groupType = UIGroupType_Globals;
    pVVar14->allowLexicalThis = false;
    pVVar14->allowSuperReference = false;
    (pVVar14->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
         (_func_int **)&PTR_Get_014f87b0;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar12,0);
    iVar7 = (pLVar12->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer[iVar7] = pVVar14;
    (pLVar12->super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = iVar7 + 1;
  }
  return;
}

Assistant:

LocalsWalker::LocalsWalker(DiagStackFrame* _frame, DWORD _frameWalkerFlags)
        :  pFrame(_frame), frameWalkerFlags(_frameWalkerFlags), pVarWalkers(nullptr), totalLocalsCount(0), hasUserNotDefinedArguments(false)
    {
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
        if (pFBody && !pFBody->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            // Allocate the container of all walkers.
            ArenaAllocator *arena = pFrame->GetArena();
            pVarWalkers = JsUtil::List<VariableWalkerBase *, ArenaAllocator>::New(arena);

            // Top most function will have one of these regslot, slotarray or activation object.

            FrameDisplay * pDisplay = pFrame->GetFrameDisplay();
            uint scopeCount = (uint)(pDisplay ? pDisplay->GetLength() : 0);

            uint nextStartIndex = 0;

            // Add the catch/with/block expression scope objects.
            if (pFBody->GetScopeObjectChain())
            {
                pVarWalkers->Add(Anew(arena, DiagScopeVariablesWalker, pFrame, nullptr, !!(frameWalkerFlags & FrameWalkerFlags::FW_EnumWithScopeAlso)));
            }

            // In the eval function, we will not show global items directly, instead they should go as a group node.
            bool shouldAddGlobalItemsDirectly = pFBody->GetIsGlobalFunc() && !pFBody->IsEval();
            bool dontAddGlobalsDirectly = (frameWalkerFlags & FrameWalkerFlags::FW_DontAddGlobalsDirectly) == FrameWalkerFlags::FW_DontAddGlobalsDirectly;
            if (shouldAddGlobalItemsDirectly && !dontAddGlobalsDirectly)
            {
                // Global properties will be enumerated using RootObjectVariablesWalker
                pVarWalkers->Add(Anew(arena, RootObjectVariablesWalker, pFrame, pFrame->GetRootObject(), UIGroupType_None));
            }

            DebuggerScope *formalScope = GetScopeWhenHaltAtFormals(pFrame);
            DWORD localsType = GetCurrentFramesLocalsType(pFrame);

            // If we are in the formal scope of a split scoped function then we can skip checking the body scope
            if (!VariableWalkerBase::IsInParamScope(formalScope, pFrame) || pFBody->IsParamAndBodyScopeMerged())
            {
                VariableWalkerBase *pVarWalker = nullptr;

                // More than one localsType can occur in the scope
                if (localsType & FramesLocalType::LocalType_InObject)
                {
                    Assert(scopeCount > 0);
                    pVarWalker = Anew(arena, ObjectVariablesWalker, pFrame, pDisplay->GetItem(nextStartIndex), UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference));
                    nextStartIndex++;
                }
                else if (localsType & FramesLocalType::LocalType_InSlot)
                {
                    Assert(scopeCount > 0);
                    pVarWalker = Anew(arena, SlotArrayVariablesWalker, pFrame, (Js::Var *)pDisplay->GetItem(nextStartIndex), UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference));
                    nextStartIndex++;
                }
                else if (scopeCount > 0 && pFBody->GetFrameDisplayRegister() != 0 && pFBody->IsParamAndBodyScopeMerged())
                {
                    Assert((Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull());
                    nextStartIndex++;
                }

                if (pVarWalker)
                {
                    pVarWalkers->Add(pVarWalker);
                }
            }

            // If we are halted at formal place, and param and body scopes are splitted we need to make use of formal debugger scope to to determine the locals type.
            if (formalScope != nullptr && !pFBody->IsParamAndBodyScopeMerged())
            {
                if (pFBody->GetPropertyIdOnRegSlotsContainer() && pFBody->GetPropertyIdOnRegSlotsContainer()->formalsUpperBound != Js::Constants::NoRegister)
                {
                    localsType |= FramesLocalType::LocalType_Reg;
                }

                Assert(scopeCount > 0);
                if (formalScope->scopeType == Js::DiagParamScopeInObject)
                {
                    // Need to add the param scope frame display as a separate walker as the ObjectVariablesWalker directly uses the socpe object to retrieve properties
                    pVarWalkers->Add(Anew(arena, ObjectVariablesWalker, pFrame, pDisplay->GetItem(nextStartIndex), UIGroupType_Param, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                }
                else
                {
                    pVarWalkers->Add(Anew(arena, SlotArrayVariablesWalker, pFrame, (Js::Var *)pDisplay->GetItem(nextStartIndex), UIGroupType_Param, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                }
                nextStartIndex++;
            }

            if (localsType & FramesLocalType::LocalType_Reg)
            {
                pVarWalkers->Add(Anew(arena, RegSlotVariablesWalker, pFrame, nullptr /*not debugger scope*/, UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
            }

            const Js::Var nullVar = pFrame->GetScriptContext()->GetLibrary()->GetNull();
            for (uint i = nextStartIndex; i < (uint)scopeCount; i++)
            {
                Var currentScopeObject = pDisplay->GetItem(i);
                if (currentScopeObject != nullptr && currentScopeObject != nullVar) // Skip nullptr (dummy scope)
                {
                    ScopeType scopeType = FrameDisplay::GetScopeType(currentScopeObject);
                    switch(scopeType)
                    {
                    case ScopeType_ActivationObject:
                        pVarWalkers->Add(Anew(arena, ObjectVariablesWalker, pFrame, currentScopeObject, UIGroupType_Scope, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                        break;
                    case ScopeType_SlotArray:
                        pVarWalkers->Add(Anew(arena, SlotArrayVariablesWalker, pFrame, currentScopeObject, UIGroupType_Scope, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                        break;
                    case ScopeType_WithScope:
                        if( (frameWalkerFlags & FrameWalkerFlags::FW_EnumWithScopeAlso) == FrameWalkerFlags::FW_EnumWithScopeAlso)
                        {
                            RecyclableObjectWalker* withScopeWalker = Anew(arena, RecyclableObjectWalker, pFrame->GetScriptContext(), currentScopeObject);
                            pVarWalkers->Add(Anew(arena, DiagScopeVariablesWalker, pFrame, currentScopeObject, withScopeWalker));
                        }
                        break;
                    default:
                        Assert(false);
                    }
                }
            }

            // No need to add global properties if this is a global function, as it is already done above.
            if (!shouldAddGlobalItemsDirectly && !dontAddGlobalsDirectly)
            {
                pVarWalkers->Add(Anew(arena, RootObjectVariablesWalker, pFrame, pFrame->GetRootObject(),  UIGroupType_Globals));
            }
        }
    }